

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

entrypoint * dmrC_linearize_symbol(dmr_C *C,symbol *sym)

{
  symbol *base_type_00;
  symbol *base_type;
  symbol *sym_local;
  dmr_C *C_local;
  
  if (sym == (symbol *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else {
    C->L->current_pos = sym->pos;
    base_type_00 = *(symbol **)((long)&sym->field_14 + 0x38);
    if (base_type_00 == (symbol *)0x0) {
      C_local = (dmr_C *)0x0;
    }
    else if (((undefined1  [232])*base_type_00 & (undefined1  [232])0xff) == (undefined1  [232])0x5)
    {
      C_local = (dmr_C *)linearize_fn(C,sym,base_type_00);
    }
    else {
      C_local = (dmr_C *)0x0;
    }
  }
  return (entrypoint *)C_local;
}

Assistant:

struct entrypoint *dmrC_linearize_symbol(struct dmr_C *C, struct symbol *sym)
{
	struct symbol *base_type;

	if (!sym)
		return NULL;
	C->L->current_pos = sym->pos;
	base_type = sym->ctype.base_type;
	if (!base_type)
		return NULL;
	if (base_type->type == SYM_FN)
		return linearize_fn(C, sym, base_type);
	return NULL;
}